

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

ByteData * __thiscall
cfd::TransactionController::CreateSignatureHash
          (TransactionController *this,Txid *txid,uint32_t vout,Script *redeem_script,
          SigHashType *sighash_type,Amount *value,WitnessVersion version)

{
  uint32_t txin_index_00;
  uint32_t in_ECX;
  Txid *in_RDX;
  long in_RSI;
  ByteData *in_RDI;
  Script *in_R8;
  SigHashType *in_R9;
  Amount *in_stack_00000008;
  WitnessVersion in_stack_00000010;
  ByteData256 sighash;
  uint32_t txin_index;
  ByteData *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  SigHashType local_74;
  ByteData local_68;
  ByteData256 local_50;
  uint32_t local_34;
  Script *local_28;
  
  this_00 = in_RDI;
  local_28 = in_R8;
  txin_index_00 = core::Transaction::GetTxInIndex((Transaction *)(in_RSI + 0x10),in_RDX,in_ECX);
  local_34 = txin_index_00;
  core::Script::GetData(&local_68,local_28);
  core::SigHashType::SigHashType(&local_74,in_R9);
  core::Transaction::GetSignatureHash
            (&local_50,(Transaction *)(in_RSI + 0x10),txin_index_00,&local_68,&local_74,
             in_stack_00000008,in_stack_00000010);
  core::ByteData::~ByteData((ByteData *)0x540231);
  core::ByteData256::GetBytes(&local_a0,&local_50);
  core::ByteData::ByteData(in_RDI,&local_a0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this_00->data_);
  core::ByteData256::~ByteData256((ByteData256 *)0x54026d);
  return this_00;
}

Assistant:

ByteData TransactionController::CreateSignatureHash(
    const Txid& txid, uint32_t vout, const Script& redeem_script,
    SigHashType sighash_type, const Amount& value,
    WitnessVersion version) const {
  uint32_t txin_index = transaction_.GetTxInIndex(txid, vout);
  // TODO(soejima): OP_CODESEPARATOR存在時、Scriptの分割が必要。
  ByteData256 sighash = transaction_.GetSignatureHash(
      txin_index, redeem_script.GetData(), sighash_type, value, version);
  return ByteData(sighash.GetBytes());
}